

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O1

void * encode_bmp_to_jpegls
                 (void *pixel_data,size_t stride,bmp_dib_header_t *header,
                 charls_interleave_mode interleave_mode,int near_lossless,size_t *bytes_written)

{
  uint uVar1;
  size_t __size;
  charls_jpegls_errc cVar2;
  charls_jpegls_encoder *encoder;
  void *destination_buffer;
  uint8_t *planar_buffer;
  uint32_t vertical_resolution;
  charls_spiff_resolution_units_conflict1 resolution_units;
  size_t height;
  char *pcVar3;
  uint32_t horizontal_resolution;
  size_t encoded_buffer_size;
  charls_frame_info frame_info;
  size_t local_50;
  charls_frame_info local_48;
  
  if (header->depth != 0x18) {
    __assert_fail("header->depth == 24 && \"This function only supports 24-bit BMP pixel data.\"",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/cornerstonejs[P]charls/samples/convert.c/main.c"
                  ,0xbd,
                  "void *encode_bmp_to_jpegls(const void *, const size_t, const bmp_dib_header_t *, const charls_interleave_mode, const int, size_t *)"
                 );
  }
  if (header->compress_type != 0) {
    __assert_fail("header->compress_type == 0 && \"Data needs to be stored by pixel as RGB.\"",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/cornerstonejs[P]charls/samples/convert.c/main.c"
                  ,0xbe,
                  "void *encode_bmp_to_jpegls(const void *, const size_t, const bmp_dib_header_t *, const charls_interleave_mode, const int, size_t *)"
                 );
  }
  if (header->width == 0) {
    __assert_fail("header->width > 0 && \"0 width not supported, may cause 0 byte malloc\"",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/cornerstonejs[P]charls/samples/convert.c/main.c"
                  ,0xbf,
                  "void *encode_bmp_to_jpegls(const void *, const size_t, const bmp_dib_header_t *, const charls_interleave_mode, const int, size_t *)"
                 );
  }
  if (0 < header->height) {
    encoder = charls_jpegls_encoder_create();
    if (encoder == (charls_jpegls_encoder *)0x0) {
      puts("Failed to create JPEG-LS encoder");
    }
    else {
      local_48.bits_per_sample = 8;
      local_48.component_count = 3;
      local_48.width = header->width;
      local_48.height = header->height;
      cVar2 = charls_jpegls_encoder_set_frame_info(encoder,&local_48);
      if (cVar2 == CHARLS_JPEGLS_ERRC_SUCCESS) {
        cVar2 = charls_jpegls_encoder_set_interleave_mode(encoder,interleave_mode);
        if (cVar2 == CHARLS_JPEGLS_ERRC_SUCCESS) {
          cVar2 = charls_jpegls_encoder_set_near_lossless(encoder,near_lossless);
          if (cVar2 == CHARLS_JPEGLS_ERRC_SUCCESS) {
            cVar2 = charls_jpegls_encoder_get_estimated_destination_size(encoder,&local_50);
            if (cVar2 == CHARLS_JPEGLS_ERRC_SUCCESS) {
              destination_buffer = malloc(local_50);
              if (destination_buffer != (void *)0x0) {
                cVar2 = charls_jpegls_encoder_set_destination_buffer
                                  (encoder,destination_buffer,local_50);
                if (cVar2 == CHARLS_JPEGLS_ERRC_SUCCESS) {
                  if ((header->vertical_resolution < 100) || (header->horizontal_resolution < 100))
                  {
                    resolution_units = aspect_ratio;
                    vertical_resolution = 1;
                    horizontal_resolution = 1;
                  }
                  else {
                    vertical_resolution = header->vertical_resolution / 100;
                    horizontal_resolution = header->horizontal_resolution / 100;
                    resolution_units = dots_per_centimeter;
                  }
                  cVar2 = charls_jpegls_encoder_write_standard_spiff_header
                                    (encoder,rgb,resolution_units,vertical_resolution,
                                     horizontal_resolution);
                  if (cVar2 == CHARLS_JPEGLS_ERRC_SUCCESS) {
                    height = (size_t)header->height;
                    if (interleave_mode == CHARLS_INTERLEAVE_MODE_NONE) {
                      uVar1 = header->width;
                      __size = height * uVar1 * 3;
                      planar_buffer = (uint8_t *)malloc(__size);
                      if (planar_buffer == (uint8_t *)0x0) {
                        handle_encoder_failure
                                  (CHARLS_JPEGLS_ERRC_NOT_ENOUGH_MEMORY,"malloc",encoder,
                                   destination_buffer);
                        return (void *)0x0;
                      }
                      triplet_to_planar((uint8_t *)pixel_data,planar_buffer,(ulong)uVar1,height,
                                        stride);
                      cVar2 = charls_jpegls_encoder_encode_from_buffer
                                        (encoder,planar_buffer,__size,0);
                      free(planar_buffer);
                    }
                    else {
                      cVar2 = charls_jpegls_encoder_encode_from_buffer
                                        (encoder,pixel_data,height * stride,(uint32_t)stride);
                    }
                    if (cVar2 == CHARLS_JPEGLS_ERRC_SUCCESS) {
                      cVar2 = charls_jpegls_encoder_get_bytes_written(encoder,bytes_written);
                      if (cVar2 == CHARLS_JPEGLS_ERRC_SUCCESS) {
                        charls_jpegls_encoder_destroy(encoder);
                        return destination_buffer;
                      }
                      pcVar3 = "get bytes written";
                    }
                    else {
                      pcVar3 = "encode";
                    }
                  }
                  else {
                    pcVar3 = "write_standard_spiff_header";
                  }
                }
                else {
                  pcVar3 = "set destination buffer";
                }
                handle_encoder_failure(cVar2,pcVar3,encoder,destination_buffer);
                return (void *)0x0;
              }
              pcVar3 = "malloc failed";
              cVar2 = CHARLS_JPEGLS_ERRC_SUCCESS;
            }
            else {
              pcVar3 = "get estimated destination size";
            }
          }
          else {
            pcVar3 = "set near lossless";
          }
        }
        else {
          pcVar3 = "set near interleave mode";
        }
      }
      else {
        pcVar3 = "set frame_info";
      }
      handle_encoder_failure(cVar2,pcVar3,encoder,(void *)0x0);
    }
    return (void *)0x0;
  }
  __assert_fail("header->height > 0 && \"0 and negative height not supported, may cause 0 byte malloc\""
                ,
                "/workspace/llm4binary/github/license_all_cmakelists_1510/cornerstonejs[P]charls/samples/convert.c/main.c"
                ,0xc0,
                "void *encode_bmp_to_jpegls(const void *, const size_t, const bmp_dib_header_t *, const charls_interleave_mode, const int, size_t *)"
               );
}

Assistant:

static void* encode_bmp_to_jpegls(const void* pixel_data, const size_t stride, const bmp_dib_header_t* header,
                                  const charls_interleave_mode interleave_mode, const int near_lossless,
                                  size_t* bytes_written)
{
    assert(header->depth == 24 && "This function only supports 24-bit BMP pixel data.");
    assert(header->compress_type == 0 && "Data needs to be stored by pixel as RGB.");
    assert(header->width > 0 && "0 width not supported, may cause 0 byte malloc");
    assert(header->height > 0 && "0 and negative height not supported, may cause 0 byte malloc");

    charls_jpegls_encoder* encoder = charls_jpegls_encoder_create();
    if (!encoder)
    {
        printf("Failed to create JPEG-LS encoder\n");
        return NULL;
    }

    charls_frame_info frame_info = {.bits_per_sample = 8, .component_count = 3};
    frame_info.width = header->width;
    frame_info.height = (uint32_t)header->height;
    charls_jpegls_errc error = charls_jpegls_encoder_set_frame_info(encoder, &frame_info);
    if (error)
    {
        return handle_encoder_failure(error, "set frame_info", encoder, NULL);
    }

    error = charls_jpegls_encoder_set_interleave_mode(encoder, interleave_mode);
    if (error)
    {
        return handle_encoder_failure(error, "set near interleave mode", encoder, NULL);
    }

    error = charls_jpegls_encoder_set_near_lossless(encoder, near_lossless);
    if (error)
    {
        return handle_encoder_failure(error, "set near lossless", encoder, NULL);
    }

    size_t encoded_buffer_size;
    error = charls_jpegls_encoder_get_estimated_destination_size(encoder, &encoded_buffer_size);
    if (error)
    {
        return handle_encoder_failure(error, "get estimated destination size", encoder, NULL);
    }

    void* encoded_buffer = malloc(encoded_buffer_size);
    if (!encoded_buffer)
    {
        return handle_encoder_failure(error, "malloc failed", encoder, NULL);
    }

    error = charls_jpegls_encoder_set_destination_buffer(encoder, encoded_buffer, encoded_buffer_size);
    if (error)
    {
        return handle_encoder_failure(error, "set destination buffer", encoder, encoded_buffer);
    }

    // The resolution in BMP files is often 0 to indicate that no resolution has been defined.
    // The SPIFF header specification requires however that VRES and HRES are never 0.
    // The ISO 10918-3 recommendation for these cases is to define that the pixels should be interpreted as a square.
    if (header->vertical_resolution < 100 || header->horizontal_resolution < 100)
    {
        error = charls_jpegls_encoder_write_standard_spiff_header(encoder, CHARLS_SPIFF_COLOR_SPACE_RGB,
                                                                  CHARLS_SPIFF_RESOLUTION_UNITS_ASPECT_RATIO, 1, 1);
    }
    else
    {
        error = charls_jpegls_encoder_write_standard_spiff_header(
            encoder, CHARLS_SPIFF_COLOR_SPACE_RGB, CHARLS_SPIFF_RESOLUTION_UNITS_DOTS_PER_CENTIMETER,
            header->vertical_resolution / 100, header->horizontal_resolution / 100);
    }

    if (error)
    {
        return handle_encoder_failure(error, "write_standard_spiff_header", encoder, encoded_buffer);
    }

    if (interleave_mode == CHARLS_INTERLEAVE_MODE_NONE)
    {
        const size_t pixel_data_size = (size_t)header->height * header->width * bytes_per_rgb_pixel;
        void* planar_pixel_data = malloc(pixel_data_size);
        if (!planar_pixel_data)
        {
            return handle_encoder_failure(CHARLS_JPEGLS_ERRC_NOT_ENOUGH_MEMORY, "malloc", encoder, encoded_buffer);
        }

        triplet_to_planar(pixel_data, planar_pixel_data, header->width, (size_t)header->height, stride);
        error = charls_jpegls_encoder_encode_from_buffer(encoder, planar_pixel_data, pixel_data_size, 0);
        free(planar_pixel_data);
    }
    else
    {
        const size_t pixel_data_size = (size_t)header->height * stride;
        error = charls_jpegls_encoder_encode_from_buffer(encoder, pixel_data, pixel_data_size, (uint32_t)stride);
    }

    if (error)
    {
        return handle_encoder_failure(error, "encode", encoder, encoded_buffer);
    }

    error = charls_jpegls_encoder_get_bytes_written(encoder, bytes_written);
    if (error)
    {
        return handle_encoder_failure(error, "get bytes written", encoder, encoded_buffer);
    }

    charls_jpegls_encoder_destroy(encoder);

    return encoded_buffer;
}